

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

size_t __thiscall
llama_context::state_seq_get_data(llama_context *this,llama_seq_id seq_id,uint8_t *dst,size_t size)

{
  llama_io_write_i *in_RDI;
  exception *err;
  llama_io_write_buffer io;
  llama_context *this_00;
  uint8_t *in_stack_ffffffffffffff98;
  llama_io_write_buffer *in_stack_ffffffffffffffa0;
  size_t local_8;
  
  this_00 = (llama_context *)&stack0xffffffffffffffb8;
  llama_io_write_buffer::llama_io_write_buffer
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(size_t)this_00);
  local_8 = state_seq_write_data(this_00,in_RDI,0);
  llama_io_write_buffer::~llama_io_write_buffer((llama_io_write_buffer *)0x3e002f);
  return local_8;
}

Assistant:

size_t llama_context::state_seq_get_data(llama_seq_id seq_id, uint8_t * dst, size_t size) {
    llama_io_write_buffer io(dst, size);
    try {
        return state_seq_write_data(io, seq_id);
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: error saving state: %s\n", __func__, err.what());
        return 0;
    }
}